

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBlock::FillFreeMemory
          (LargeHeapBlock *this,Recycler *recycler,void *address,size_t size)

{
  bool bVar1;
  BOOL BVar2;
  IdleDecommitPageAllocator *this_00;
  byte local_29;
  bool doMemFill;
  byte memFill;
  size_t size_local;
  void *address_local;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  local_29 = 0xfe;
  BVar2 = Recycler::VerifyEnabled(recycler);
  if (BVar2 != 0) {
    local_29 = 0xca;
  }
  bVar1 = InPageHeapMode(this);
  if ((bVar1) && ((this->pageHeapData->isLockedWithPageHeap & 1U) != 0)) {
    PageHeapUnLockPages(this);
  }
  memset(address,(uint)local_29,size);
  bVar1 = InPageHeapMode(this);
  if (bVar1) {
    this_00 = HeapBlock::GetPageAllocator(&this->super_HeapBlock,this->heapInfo);
    bVar1 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::IsPageReuseDisabled(&this_00->super_PageAllocator);
    if (bVar1) {
      PageHeapLockPages(this);
    }
  }
  return;
}

Assistant:

void LargeHeapBlock::FillFreeMemory(Recycler * recycler, __in_bcount(size) void * address, size_t size)
{
    // For now, we don't do anything in release build because we don't reuse this memory until we return
    // the pages to the allocator which will zero out the whole page
    byte memFill = 0;
    bool doMemFill = false;

#ifdef RECYCLER_FREE_MEM_FILL
    memFill = DbgMemFill;
    doMemFill = true;
#endif

#ifdef RECYCLER_MEMORY_VERIFY
    if (recycler->VerifyEnabled())
    {
        memFill = Recycler::VerifyMemFill;
        doMemFill = true;
    }
#endif

#if defined(RECYCLER_FREE_MEM_FILL) || defined(RECYCLER_MEMORY_VERIFY)
    if (doMemFill)
    {
        if (this->InPageHeapMode() && pageHeapData->isLockedWithPageHeap) 
        {
            PageHeapUnLockPages();
        }
        memset(address, memFill, size);
    }
#endif

#if defined(RECYCLER_NO_PAGE_REUSE)
    if (this->InPageHeapMode() && this->GetPageAllocator(this->heapInfo)->IsPageReuseDisabled())
    {
        this->PageHeapLockPages();
    }
#endif
}